

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O0

void dbg_text(char *tgt,int min,int max,int sd)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  char *in_RDI;
  int nLifeNoise;
  char *cp;
  char sentence [257];
  long needed;
  long s_len;
  long wordlen;
  long hgOffset;
  long hgLength;
  undefined4 in_stack_fffffffffffffea8;
  int iVar5;
  char *in_stack_fffffffffffffeb0;
  long in_stack_fffffffffffffeb8;
  long *in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffedc;
  char *in_stack_fffffffffffffee0;
  char *local_30;
  long local_28;
  
  local_30 = (char *)0x0;
  iVar5 = 0;
  if (dbg_text::bInit == 0) {
    in_stack_fffffffffffffeb0 = dbg_text::szTextPool;
    if (0 < verbose) {
      fprintf(_stderr,"\nPreloading text ... ");
    }
    for (; (long)local_30 < 0x12c00000; local_30 = pcVar3 + (long)local_30) {
      if ((0 < verbose) && ((long)iVar5 < (long)local_30)) {
        iVar5 = iVar5 + 200000;
        fprintf(_stderr,"%3.0f%%\b\b\b\b",((double)(long)local_30 * 100.0) / 314572800.0);
      }
      iVar1 = txt_sentence(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
      lVar2 = (long)iVar1;
      if (lVar2 < 0) {
        fprintf(_stderr,"%s","Bad sentence formation");
        abort();
      }
      pcVar3 = dbg_text::szTextPool +
               (long)(dbg_text::szTextPool +
                     (long)(dbg_text::szTextPool +
                           (long)(dbg_text::szTextPool + (0x127c1e00 - (long)local_30))));
      if ((long)pcVar3 < lVar2 + 1) {
        (&stack0x12af0638)[(long)(pcVar3 + -0x12af0780)] = 0;
        strcpy(in_stack_fffffffffffffeb0,&stack0xfffffffffffffeb8);
        in_stack_fffffffffffffeb0 = in_stack_fffffffffffffeb0 + (long)pcVar3;
      }
      else {
        strcpy(in_stack_fffffffffffffeb0,&stack0xfffffffffffffeb8);
        pcVar4 = in_stack_fffffffffffffeb0 + lVar2;
        pcVar3 = (char *)(lVar2 + 1);
        in_stack_fffffffffffffeb0 = pcVar4 + 1;
        *pcVar4 = ' ';
      }
    }
    *in_stack_fffffffffffffeb0 = '\0';
    dbg_text::bInit = 1;
    if (0 < verbose) {
      fprintf(_stderr,"\n");
    }
  }
  dss_random(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,(long)in_stack_fffffffffffffeb0,
             CONCAT44(iVar5,in_stack_fffffffffffffea8));
  dss_random(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,(long)in_stack_fffffffffffffeb0,
             CONCAT44(iVar5,in_stack_fffffffffffffea8));
  strncpy(in_RDI,dbg_text::szTextPool + local_28,0);
  *in_RDI = '\0';
  return;
}

Assistant:

void
dbg_text(char *tgt, int min, int max, int sd)
{
   DSS_HUGE hgLength = 0,
      hgOffset,
      wordlen = 0,
      s_len,
      needed;
   char sentence[MAX_SENT_LEN + 1],
      *cp;
   static char szTextPool[TEXT_POOL_SIZE + 1];
   static int bInit = 0;
   int nLifeNoise = 0;
   
   if (!bInit)
   {
      cp = &szTextPool[0];
      if (verbose > 0)
         fprintf(stderr, "\nPreloading text ... ");
      
      while (wordlen < TEXT_POOL_SIZE)
      {
         if ((verbose > 0) && (wordlen > nLifeNoise))
         {
            nLifeNoise += 200000;
            fprintf(stderr, "%3.0f%%\b\b\b\b", (100.0 * wordlen)/TEXT_POOL_SIZE);
         }
         
         s_len = txt_sentence(sentence, 5);
         if ( s_len < 0)
            INTERNAL_ERROR("Bad sentence formation");
         needed = TEXT_POOL_SIZE - wordlen;
         if (needed >= (s_len + 1))	/* need the entire sentence */
         {
            strcpy(cp, sentence);
            cp += s_len;
            wordlen += s_len + 1;
            *(cp++) = ' ';
         }
         else /* chop the new sentence off to match the length target */
         {
            sentence[needed] = '\0';
            strcpy(cp, sentence);
            wordlen += needed;
            cp += needed;
         }
      }
      *cp = '\0';
      bInit = 1;
      if (verbose > 0)
         fprintf(stderr, "\n");
   }

   RANDOM(hgOffset, 0, TEXT_POOL_SIZE - max, sd);
   RANDOM(hgLength, min, max, sd);
   strncpy(&tgt[0], &szTextPool[hgOffset], (int)hgLength);
   tgt[hgLength] = '\0';

	return;
}